

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Registry_impl.hpp
# Opt level: O1

bean_ptr<A> * hiberlite::Registry<A>::get(bean_ptr<A> *__return_storage_ptr__,bean_key *key)

{
  int *piVar1;
  _Base_ptr p_Var2;
  iterator iVar3;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar4;
  bean_key local_30;
  
  iVar3 = std::
          _Rb_tree<hiberlite::bean_key,_std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>,_std::_Select1st<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>_>
          ::find((_Rb_tree<hiberlite::bean_key,_std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>,_std::_Select1st<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>,_std::less<hiberlite::bean_key>,_std::allocator<std::pair<const_hiberlite::bean_key,_hiberlite::rb_pair<A>_*>_>_>
                  *)rbpairs,key);
  if (iVar3._M_node == (_Base_ptr)(rbpairs + 8)) {
    local_30.id = key->id;
    local_30.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
    local_30.con.res = (key->con).res;
    if (local_30.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (local_30.con.res)->refCount = (local_30.con.res)->refCount + 1;
    }
    createBeanPtr(__return_storage_ptr__,&local_30,(A *)0x0);
    local_30.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d4578;
    psVar4 = local_30.con.res;
  }
  else {
    psVar4 = (key->con).res;
    if (psVar4 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      psVar4->refCount = psVar4->refCount + 1;
    }
    p_Var2 = iVar3._M_node[1]._M_right;
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<A>_>)._vptr_shared_res =
         (_func_int **)&PTR__shared_res_001d45a8;
    (__return_storage_ptr__->super_shared_res<hiberlite::real_bean<A>_>).res =
         (shared_cnt_obj_pair<hiberlite::real_bean<A>_> *)p_Var2;
    if (p_Var2 != (_Base_ptr)0x0) {
      *(int *)&p_Var2->_M_left = *(int *)&p_Var2->_M_left + 1;
    }
  }
  if (psVar4 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &psVar4->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*psVar4->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

bean_ptr<C> Registry<C>::get(const bean_key key)
{
	typename std::map<bean_key,rb_pair<C>* >::iterator it;
	it=rbpairs.find(key);
	if(it==rbpairs.end())
		return createBeanPtr(key,NULL);
	else
		return bean_ptr<C>(key, it->second);
}